

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::GenerateHeader
          (FileGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  char *pcVar6;
  FileDescriptor *pFVar7;
  undefined8 uVar8;
  long lVar9;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator;
  pointer puVar10;
  unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
  *generator_1;
  pointer puVar11;
  pointer puVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  string header_extension;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fwd_decls;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ImportWriter local_118;
  
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_118.generate_for_named_framework_.field_2;
  local_118.generate_for_named_framework_._M_dataplus._M_p = (pointer)paVar1;
  if (this->is_bundled_proto_ == true) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"GPBDescriptor.h","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               &local_118.generate_for_named_framework_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.generate_for_named_framework_._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.generate_for_named_framework_._M_dataplus._M_p);
    }
    local_118.generate_for_named_framework_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"GPBMessage.h","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               &local_118.generate_for_named_framework_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.generate_for_named_framework_._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.generate_for_named_framework_._M_dataplus._M_p);
    }
    local_118.generate_for_named_framework_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"GPBRootObject.h","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               &local_118.generate_for_named_framework_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"GPBProtocolBuffers.h","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158,
               &local_118.generate_for_named_framework_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.generate_for_named_framework_._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.generate_for_named_framework_._M_dataplus._M_p);
  }
  PrintFileRuntimePreamble(this,printer,&local_158);
  local_118.generate_for_named_framework_._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = FastInt32ToBufferLeft(0x7534,paVar1->_M_local_buf);
  local_118.generate_for_named_framework_._M_string_length = (long)pcVar6 - (long)paVar1;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,local_118.generate_for_named_framework_._M_dataplus._M_p,
             local_118.generate_for_named_framework_._M_dataplus._M_p +
             local_118.generate_for_named_framework_._M_string_length);
  io::Printer::Print<char[29],std::__cxx11::string>
            (printer,
             "#if GOOGLE_PROTOBUF_OBJC_VERSION < $google_protobuf_objc_version$\n#error This file was generated by a newer version of protoc which is incompatible with your Protocol Buffer library sources.\n#endif\n#if $google_protobuf_objc_version$ < GOOGLE_PROTOBUF_OBJC_MIN_SUPPORTED_VERSION\n#error This file was generated by an older version of protoc which is incompatible with your Protocol Buffer library sources.\n#endif\n\n"
             ,(char (*) [29])"google_protobuf_objc_version",&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  ImportWriter::ImportWriter
            (&local_118,&(this->options_).generate_for_named_framework,
             &(this->options_).named_framework_to_proto_path_mappings_path,
             &(this->options_).runtime_import_prefix,this->is_bundled_proto_);
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,".pbobjc.h","");
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x24)) {
    lVar9 = 0;
    do {
      pFVar7 = FileDescriptor::dependency(pFVar7,*(int *)(*(long *)(pFVar7 + 0x48) + lVar9 * 4));
      ImportWriter::AddFile(&local_118,pFVar7,&local_138);
      lVar9 = lVar9 + 1;
      pFVar7 = this->file_;
    } while (lVar9 < *(int *)(pFVar7 + 0x24));
  }
  ImportWriter::Print(&local_118,printer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  ImportWriter::~ImportWriter(&local_118);
  io::Printer::Print<>
            (printer,
             "// @@protoc_insertion_point(imports)\n\n#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n\nCF_EXTERN_C_BEGIN\n\n"
            );
  psVar2 = &local_118.generate_for_named_framework_._M_string_length;
  local_118.generate_for_named_framework_._M_string_length =
       local_118.generate_for_named_framework_._M_string_length & 0xffffffff00000000;
  local_118.generate_for_named_framework_.field_2._M_allocated_capacity = 0;
  local_118.named_framework_to_proto_path_mappings_path_._M_string_length = 0;
  puVar10 = (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = psVar2;
  local_118.generate_for_named_framework_.field_2._8_8_ = psVar2;
  local_118.named_framework_to_proto_path_mappings_path_._M_dataplus._M_p = (pointer)psVar2;
  if (puVar10 != puVar3) {
    do {
      MessageGenerator::DetermineForwardDeclarations
                ((puVar10->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                 ._M_head_impl,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_118);
      puVar10 = puVar10 + 1;
      uVar8 = local_118.generate_for_named_framework_.field_2._8_8_;
    } while (puVar10 != puVar3);
  }
  for (; (size_type *)uVar8 != psVar2; uVar8 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar8))
  {
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,"$value$;\n",(char (*) [6])0x43fa60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar8 + 0x20));
  }
  if ((size_type *)local_118.generate_for_named_framework_.field_2._8_8_ != psVar2) {
    io::Printer::Print<>(printer,"\n");
  }
  io::Printer::Print<>(printer,"NS_ASSUME_NONNULL_BEGIN\n\n");
  puVar4 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar11 = (this->enum_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar4; puVar11 = puVar11 + 1
      ) {
    EnumGenerator::GenerateHeader
              ((puVar11->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_false>
               ._M_head_impl,printer);
  }
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3; puVar10 = puVar10 + 1
      ) {
    MessageGenerator::GenerateEnumHeader
              ((puVar10->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
               ._M_head_impl,printer);
  }
  io::Printer::Print<char[16],std::__cxx11::string>
            (printer,
             "#pragma mark - $root_class_name$\n\n/**\n * Exposes the extension registry for this file.\n *\n * The base class provides:\n * @code\n *   + (GPBExtensionRegistry *)extensionRegistry;\n * @endcode\n * which is a @c GPBExtensionRegistry that includes all the extensions defined by\n * this file and all files that it depends on.\n **/\nGPB_FINAL @interface $root_class_name$ : GPBRootObject\n@end\n\n"
             ,(char (*) [16])"root_class_name",&this->root_class_name_);
  if ((this->extension_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->extension_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Print<char[16],std::__cxx11::string>
              (printer,"@interface $root_class_name$ (DynamicMethods)\n",
               (char (*) [16])"root_class_name",&this->root_class_name_);
    puVar5 = (this->extension_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar5;
        puVar12 = puVar12 + 1) {
      ExtensionGenerator::GenerateMembersHeader
                ((puVar12->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    io::Printer::Print<>(printer,"@end\n\n");
  }
  puVar3 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3; puVar10 = puVar10 + 1
      ) {
    MessageGenerator::GenerateMessageHeader
              ((puVar10->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
               ._M_head_impl,printer);
  }
  io::Printer::Print<>
            (printer,
             "NS_ASSUME_NONNULL_END\n\nCF_EXTERN_C_END\n\n#pragma clang diagnostic pop\n\n// @@protoc_insertion_point(global_scope)\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return;
}

Assistant:

void FileGenerator::GenerateHeader(io::Printer* printer) {
  std::vector<std::string> headers;
  // Generated files bundled with the library get minimal imports, everything
  // else gets the wrapper so everything is usable.
  if (is_bundled_proto_) {
    headers.push_back("GPBDescriptor.h");
    headers.push_back("GPBMessage.h");
    headers.push_back("GPBRootObject.h");
  } else {
    headers.push_back("GPBProtocolBuffers.h");
  }
  PrintFileRuntimePreamble(printer, headers);

  // Add some verification that the generated code matches the source the
  // code is being compiled with.
  // NOTE: This captures the raw numeric values at the time the generator was
  // compiled, since that will be the versions for the ObjC runtime at that
  // time.  The constants in the generated code will then get their values at
  // at compile time (so checking against the headers being used to compile).
  printer->Print(
      "#if GOOGLE_PROTOBUF_OBJC_VERSION < $google_protobuf_objc_version$\n"
      "#error This file was generated by a newer version of protoc which is incompatible with your Protocol Buffer library sources.\n"
      "#endif\n"
      "#if $google_protobuf_objc_version$ < GOOGLE_PROTOBUF_OBJC_MIN_SUPPORTED_VERSION\n"
      "#error This file was generated by an older version of protoc which is incompatible with your Protocol Buffer library sources.\n"
      "#endif\n"
      "\n",
      "google_protobuf_objc_version", StrCat(GOOGLE_PROTOBUF_OBJC_VERSION));

  // #import any headers for "public imports" in the proto file.
  {
    ImportWriter import_writer(
        options_.generate_for_named_framework,
        options_.named_framework_to_proto_path_mappings_path,
        options_.runtime_import_prefix,
        is_bundled_proto_);
    const std::string header_extension(kHeaderExtension);
    for (int i = 0; i < file_->public_dependency_count(); i++) {
      import_writer.AddFile(file_->public_dependency(i), header_extension);
    }
    import_writer.Print(printer);
  }

  // Note:
  //  deprecated-declarations suppression is only needed if some place in this
  //    proto file is something deprecated or if it references something from
  //    another file that is deprecated.
  printer->Print(
      "// @@protoc_insertion_point(imports)\n"
      "\n"
      "#pragma clang diagnostic push\n"
      "#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n"
      "\n"
      "CF_EXTERN_C_BEGIN\n"
      "\n");

  std::set<std::string> fwd_decls;
  for (const auto& generator : message_generators_) {
    generator->DetermineForwardDeclarations(&fwd_decls);
  }
  for (std::set<std::string>::const_iterator i(fwd_decls.begin());
       i != fwd_decls.end(); ++i) {
    printer->Print("$value$;\n", "value", *i);
  }
  if (fwd_decls.begin() != fwd_decls.end()) {
    printer->Print("\n");
  }

  printer->Print(
      "NS_ASSUME_NONNULL_BEGIN\n"
      "\n");

  // need to write out all enums first
  for (const auto& generator : enum_generators_) {
    generator->GenerateHeader(printer);
  }

  for (const auto& generator : message_generators_) {
    generator->GenerateEnumHeader(printer);
  }

  // For extensions to chain together, the Root gets created even if there
  // are no extensions.
  printer->Print(
      "#pragma mark - $root_class_name$\n"
      "\n"
      "/**\n"
      " * Exposes the extension registry for this file.\n"
      " *\n"
      " * The base class provides:\n"
      " * @code\n"
      " *   + (GPBExtensionRegistry *)extensionRegistry;\n"
      " * @endcode\n"
      " * which is a @c GPBExtensionRegistry that includes all the extensions defined by\n"
      " * this file and all files that it depends on.\n"
      " **/\n"
      "GPB_FINAL @interface $root_class_name$ : GPBRootObject\n"
      "@end\n"
      "\n",
      "root_class_name", root_class_name_);

  if (!extension_generators_.empty()) {
    // The dynamic methods block is only needed if there are extensions.
    printer->Print(
        "@interface $root_class_name$ (DynamicMethods)\n",
        "root_class_name", root_class_name_);

    for (const auto& generator : extension_generators_) {
      generator->GenerateMembersHeader(printer);
    }

    printer->Print("@end\n\n");
  }  // !extension_generators_.empty()

  for (const auto& generator : message_generators_) {
    generator->GenerateMessageHeader(printer);
  }

  printer->Print(
      "NS_ASSUME_NONNULL_END\n"
      "\n"
      "CF_EXTERN_C_END\n"
      "\n"
      "#pragma clang diagnostic pop\n"
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}